

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

double house_2(double *x,int N,double *v)

{
  double *C;
  double *__ptr;
  double dVar1;
  int local_4c;
  int i;
  double *e;
  double *sigma;
  double sc;
  double beta;
  double sgn;
  double *v_local;
  int N_local;
  double *x_local;
  
  C = (double *)malloc(8);
  __ptr = (double *)malloc((long)N << 3);
  beta = 1.0;
  mmult(x,x,C,1,N,1);
  dVar1 = sqrt(*C);
  *C = dVar1;
  *__ptr = 1.0;
  for (local_4c = 1; local_4c < N; local_4c = local_4c + 1) {
    __ptr[local_4c] = 0.0;
  }
  if (*x <= 0.0) {
    if (0.0 < *x || *x == 0.0) {
      if ((*x == 0.0) && (!NAN(*x))) {
        beta = 0.0;
      }
    }
    else {
      beta = -1.0;
    }
  }
  else {
    beta = 1.0;
  }
  *__ptr = *C * beta * *__ptr;
  for (local_4c = 0; local_4c < N; local_4c = local_4c + 1) {
    v[local_4c] = __ptr[local_4c] + x[local_4c];
  }
  mmult(v,v,C,1,N,1);
  dVar1 = sqrt(*C);
  *C = dVar1;
  for (local_4c = 0; local_4c < N; local_4c = local_4c + 1) {
    v[local_4c] = v[local_4c] / *C;
  }
  free(C);
  free(__ptr);
  return 2.0;
}

Assistant:

double house_2(double*x,int N,double *v) {
	double sgn,beta,sc;
	double *sigma,*e;
	int i;
	
	sigma = (double*) malloc(sizeof(double) * 1);
	e = (double*) malloc(sizeof(double) * N);
	
	beta = 2.0;
	sgn = 1.0;
	mmult(x,x,sigma,1,N,1);
	sigma[0] = sqrt(sigma[0]);
	
	e[0] =1.;
	for (i = 1; i < N;++i) {
		e[i] = 0.;
	}
	
	if (x[0] > 0.) {
		sgn = 1.0;
	} else if (x[0] < 0.) {
		sgn = -1.0;
	} else if (x[0] == 0.) {
		sgn = 0.;
	}
	
	sc = sigma[0] * sgn;
	
	//scale(e,N,1,sc);
	
	e[0] *= sc;
	
	for(i = 0; i < N;++i) {
		v[i] = e[i] + x[i];
	}
	
	mmult(v,v,sigma,1,N,1);
	sigma[0] = sqrt(sigma[0]);
	
	for(i = 0; i < N;++i) {
		v[i] = v[i] / sigma[0];
	}
	
	free(sigma);
	free(e);
	return beta;
}